

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::dumpString(Dumper *this,char *src,ValueLength len)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  byte *pbVar4;
  undefined8 uVar5;
  Exception *this_00;
  byte bVar6;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  byte *in_RSI;
  long *in_RDI;
  uint16_t low;
  uint16_t high;
  uint32_t value_2;
  uint16_t value_1;
  uint16_t value;
  uint16_t i2;
  uint16_t i1;
  char esc;
  uint8_t c;
  uint8_t *e;
  uint8_t *p;
  ExceptionType in_stack_ffffffffffffff7c;
  Exception *in_stack_ffffffffffffff80;
  uint16_t value_00;
  undefined4 in_stack_ffffffffffffffc0;
  short in_stack_ffffffffffffffc4;
  short in_stack_ffffffffffffffc6;
  byte *local_20;
  
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],in_RDX);
  pbVar4 = in_RSI + in_RDX;
  local_20 = in_RSI;
  do {
    if (pbVar4 <= local_20) {
      return;
    }
    bVar6 = *local_20;
    if ((bVar6 & 0x80) == 0) {
      cVar2 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar6];
      if (cVar2 == '\0') {
        (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],(int)(char)bVar6);
      }
      else if ((*(byte *)(*in_RDI + 0x21) & 1) == 0) {
        if (((cVar2 == '\"') || (cVar2 == '/')) || (cVar2 == '\\')) {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x5c);
          (**(code **)(*(long *)in_RDI[1] + 0x10))
                    ((long *)in_RDI[1],(int)cVar2,extraout_RDX_01,cVar2);
        }
        else {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x20);
        }
      }
      else {
        if ((bVar6 != 0x2f) || ((*(byte *)(*in_RDI + 0x20) & 1) != 0)) {
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],0x5c);
        }
        (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],(int)cVar2);
        if (cVar2 == 'u') {
          bVar1 = bVar6 >> 4;
          bVar6 = bVar6 & 0xf;
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],"00",2);
          if (bVar1 < 10) {
            cVar2 = bVar1 + 0x30;
          }
          else {
            cVar2 = bVar1 + 0x37;
          }
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],cVar2,extraout_RDX,cVar2);
          if (bVar6 < 10) {
            cVar2 = bVar6 + 0x30;
          }
          else {
            cVar2 = bVar6 + 0x37;
          }
          (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],cVar2,extraout_RDX_00,cVar2);
        }
      }
    }
    else {
      value_00 = (uint16_t)((ulong)in_RDI >> 0x30);
      if ((bVar6 & 0xe0) == 0xc0) {
        if (pbVar4 <= local_20 + 1) {
          uVar5 = __cxa_allocate_exception(0x18);
          Exception::Exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
        }
        if ((*(byte *)(*in_RDI + 0x22) & 1) == 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],local_20,2);
        }
        else {
          dumpUnicodeCharacter
                    ((Dumper *)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                     value_00);
        }
        local_20 = local_20 + 1;
      }
      else if ((bVar6 & 0xf0) == 0xe0) {
        if (pbVar4 <= local_20 + 2) {
          uVar5 = __cxa_allocate_exception(0x18);
          Exception::Exception(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
        }
        if ((*(byte *)(*in_RDI + 0x22) & 1) == 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],local_20,3);
        }
        else {
          dumpUnicodeCharacter
                    ((Dumper *)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                     value_00);
        }
        local_20 = local_20 + 2;
      }
      else if ((bVar6 & 0xf8) == 0xf0) {
        if (pbVar4 <= local_20 + 3) {
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          Exception::Exception(this_00,in_stack_ffffffffffffff7c);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
        if ((*(byte *)(*in_RDI + 0x22) & 1) == 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x18))((long *)in_RDI[1],local_20,4);
        }
        else {
          uVar3 = ((*local_20 & 0xf) << 0x12 | (local_20[1] & 0x3f) << 0xc |
                   (local_20[2] & 0x3f) << 6 | local_20[3] & 0x3f) - 0x10000;
          in_stack_ffffffffffffffc6 = (short)((uVar3 & 0xffc00) >> 10) + -0x2800;
          dumpUnicodeCharacter
                    ((Dumper *)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                     value_00);
          in_stack_ffffffffffffffc4 = ((ushort)uVar3 & 0x3ff) + 0xdc00;
          dumpUnicodeCharacter
                    ((Dumper *)
                     CONCAT26(in_stack_ffffffffffffffc6,
                              CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                     (uint16_t)((ulong)in_RDI >> 0x30));
        }
        local_20 = local_20 + 3;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void Dumper::dumpString(char const* src, ValueLength len) {
  static char const EscapeTable[256] = {
      // 0    1    2    3    4    5    6    7    8    9    A    B    C    D    E
      // F
      'u',  'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r',
      'u',
      'u',  // 00
      'u',  'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u',
      'u',
      'u',  // 10
      0,    0,   '"', 0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      '/',  // 20
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      0,  // 30~4F
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      '\\', 0,   0,   0,  // 50
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,
      0,  // 60~FF
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,
      0,    0,   0,   0};

  _sink->reserve(len);

  uint8_t const* p = reinterpret_cast<uint8_t const*>(src);
  uint8_t const* e = p + len;
  while (p < e) {
    uint8_t c = *p;

    if ((c & 0x80U) == 0) {
      // check for control characters
      char esc = EscapeTable[c];

      if (esc) {
        if (options->escapeControl) {
          if (c != '/' || options->escapeForwardSlashes) {
            // escape forward slashes only when requested
            _sink->push_back('\\');
          }
          _sink->push_back(static_cast<char>(esc));
          if (esc == 'u') {
            uint16_t i1 = (((uint16_t)c) & 0xf0U) >> 4;
            uint16_t i2 = (((uint16_t)c) & 0x0fU);

            _sink->append("00", 2);
            _sink->push_back(
                static_cast<char>((i1 < 10) ? ('0' + i1) : ('A' + i1 - 10)));
            _sink->push_back(
                static_cast<char>((i2 < 10) ? ('0' + i2) : ('A' + i2 - 10)));
          }
        } else {
          if (esc == '"' || esc == '/' || esc == '\\') {
            _sink->push_back('\\');
            _sink->push_back(static_cast<char>(esc));
          } else {
            _sink->push_back(' ');
          }
        }
      } else {
        _sink->push_back(static_cast<char>(c));
      }
    } else if ((c & 0xe0U) == 0xc0U) {
      // two-byte sequence
      if (p + 1 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint16_t value =
            ((((uint16_t)*p & 0x1fU) << 6) | ((uint16_t) * (p + 1) & 0x3fU));
        dumpUnicodeCharacter(value);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 2);
      }
      ++p;
    } else if ((c & 0xf0U) == 0xe0U) {
      // three-byte sequence
      if (p + 2 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint16_t value = ((((uint16_t)*p & 0x0fU) << 12) |
                          (((uint16_t) * (p + 1) & 0x3fU) << 6) |
                          ((uint16_t) * (p + 2) & 0x3fU));
        dumpUnicodeCharacter(value);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 3);
      }
      p += 2;
    } else if ((c & 0xf8U) == 0xf0U) {
      // four-byte sequence
      if (p + 3 >= e) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }

      if (options->escapeUnicode) {
        uint32_t value = ((((uint32_t)*p & 0x0fU) << 18) |
                          (((uint32_t) * (p + 1) & 0x3fU) << 12) |
                          (((uint32_t) * (p + 2) & 0x3fU) << 6) |
                          ((uint32_t) * (p + 3) & 0x3fU));
        // construct the surrogate pairs
        value -= 0x10000U;
        uint16_t high = (uint16_t)(((value & 0xffc00U) >> 10) + 0xd800);
        dumpUnicodeCharacter(high);
        uint16_t low = (value & 0x3ffU) + 0xdc00U;
        dumpUnicodeCharacter(low);
      } else {
        _sink->append(reinterpret_cast<char const*>(p), 4);
      }
      p += 3;
    }

    ++p;
  }
}